

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O0

uint32_t msr_get_supported_cpu_model(void)

{
  int iVar1;
  uint32_t local_14;
  uint32_t local_10;
  uint32_t cpu_model;
  uint32_t cpu_family;
  
  cpuid_get_family_model(&local_10,&local_14);
  iVar1 = cpuid_is_vendor_intel();
  if ((iVar1 != 0) && (iVar1 = cpuid_is_cpu_supported(local_10,local_14), iVar1 != 0)) {
    return local_14;
  }
  fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
  fprintf(_stderr,"CPU not supported: Family=%u, Model=%02X\n",(ulong)local_10,(ulong)local_14);
  return 0;
}

Assistant:

uint32_t msr_get_supported_cpu_model(void) {
  uint32_t cpu_family;
  uint32_t cpu_model;
  cpuid_get_family_model(&cpu_family, &cpu_model);
  if (!cpuid_is_vendor_intel() || !cpuid_is_cpu_supported(cpu_family, cpu_model)) {
    raplcap_log(ERROR, "CPU not supported: Family=%"PRIu32", Model=%02X\n", cpu_family, cpu_model);
    return 0;
  }
  return cpu_model;
}